

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

bool __thiscall
axl::sl::Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::
setCountImpl<axl::sl::SimpleArrayDetails<unsigned_long>::ZeroConstruct>
          (Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *this,size_t count)

{
  size_t sVar1;
  ulong uVar2;
  unsigned_long *src;
  size_t sVar3;
  BufHdr *pBVar4;
  Hdr *pHVar5;
  bool bVar6;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  sVar1 = count * 8;
  pHVar5 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_hdr;
  if ((pHVar5 != (Hdr *)0x0) && ((pHVar5->super_RefCount).m_refCount == 1)) {
    uVar2 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count;
    if (count == uVar2) {
      return true;
    }
    if (sVar1 <= pHVar5->m_bufferSize) {
      if (uVar2 <= count && count - uVar2 != 0) {
        memset((this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p +
               uVar2,0,(count - uVar2) * 8);
      }
      (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count = count;
      return true;
    }
  }
  if (count == 0) {
    ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::release
              (&this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>);
  }
  else {
    if ((this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count != 0) {
      sVar3 = getAllocSize<4096ul>(sVar1);
      pBVar4 = (BufHdr *)mem::allocate(sVar3 + 0x28);
      (pBVar4->super_RefCount).m_refCount = 0;
      (pBVar4->super_RefCount).m_weakRefCount = 1;
      (pBVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__RefCount_0014a0d8;
      pBVar4->m_bufferSize = sVar3;
      pBVar4->m_flags = 0;
      (pBVar4->super_RefCount).m_freeFunc = mem::deallocate;
      rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>(&local_38,pBVar4);
      bVar6 = local_38.m_p != (Hdr *)0x0;
      if (bVar6) {
        pHVar5 = local_38.m_p + 1;
        src = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p;
        uVar2 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count
        ;
        if (uVar2 < count) {
          __wrap_memcpy(pHVar5,src,uVar2 << 3);
          sVar1 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).
                  m_count;
          memset(&(pHVar5->super_RefCount)._vptr_RefCount + sVar1,0,(count - sVar1) * 8);
        }
        else {
          __wrap_memcpy(pHVar5,src,sVar1);
        }
        rc::RefCount::release
                  (&((this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).
                    m_hdr)->super_RefCount);
        pBVar4 = local_38.m_p;
        (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p =
             (unsigned_long *)pHVar5;
        local_38.m_p = (Hdr *)0x0;
        local_38.m_refCount = (RefCount *)0x0;
        (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_hdr = pBVar4;
        (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count = count
        ;
      }
      rc::Ptr<axl::rc::BufHdr>::~Ptr(&local_38);
      return bVar6;
    }
    bVar6 = reserve(this,count);
    if (!bVar6) {
      return false;
    }
    memset((this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p,0,sVar1)
    ;
    (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count = count;
  }
  return true;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}